

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::WriteFloatEntry
          (ColladaExporter *this,Property *pProperty,string *pTypeName)

{
  ostream *poVar1;
  string *pTypeName_local;
  Property *pProperty_local;
  ColladaExporter *this_local;
  
  if ((pProperty->exist & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<");
    poVar1 = std::operator<<(poVar1,(string *)pTypeName);
    poVar1 = std::operator<<(poVar1,">");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<float sid=\"");
    poVar1 = std::operator<<(poVar1,(string *)pTypeName);
    poVar1 = std::operator<<(poVar1,"\">");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pProperty->value);
    poVar1 = std::operator<<(poVar1,"</float>");
    std::operator<<(poVar1,(string *)&this->endstr);
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</");
    poVar1 = std::operator<<(poVar1,(string *)pTypeName);
    poVar1 = std::operator<<(poVar1,">");
    std::operator<<(poVar1,(string *)&this->endstr);
  }
  return;
}

Assistant:

void ColladaExporter::WriteFloatEntry( const Property& pProperty, const std::string& pTypeName)
{
    if(pProperty.exist) {
        mOutput << startstr << "<" << pTypeName << ">" << endstr;
        PushTag();
        mOutput << startstr << "<float sid=\"" << pTypeName << "\">" << pProperty.value << "</float>" << endstr;
        PopTag();
        mOutput << startstr << "</" << pTypeName << ">" << endstr;
    }
}